

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Performance::anon_unknown_1::OperatorPerformanceCase::render
          (OperatorPerformanceCase *this,int numDrawCalls)

{
  int iVar1;
  int iVar2;
  RenderContext *context;
  int iVar3;
  undefined4 extraout_var;
  TextureFormat local_68;
  Surface local_60;
  PixelBufferAccess local_48;
  
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  if (0 < numDrawCalls) {
    iVar1 = this->m_gridSizeX;
    iVar2 = this->m_gridSizeY;
    do {
      (**(code **)(CONCAT44(extraout_var,iVar3) + 0x538))(4,0,iVar1 * iVar2 * 6);
      numDrawCalls = numDrawCalls + -1;
    } while (numDrawCalls != 0);
  }
  context = this->m_renderCtx;
  tcu::Surface::Surface(&local_60,1,1);
  local_68.order = RGBA;
  local_68.type = UNORM_INT8;
  if ((void *)local_60.m_pixels.m_cap != (void *)0x0) {
    local_60.m_pixels.m_cap = (size_t)local_60.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_48,&local_68,local_60.m_width,local_60.m_height,1,
             (void *)local_60.m_pixels.m_cap);
  glu::readPixels(context,0,0,&local_48);
  tcu::Surface::~Surface(&local_60);
  return;
}

Assistant:

void OperatorPerformanceCase::render (int numDrawCalls)
{
	const glw::Functions&	gl				= m_renderCtx.getFunctions();
	const int				numVertices		= getNumVertices(m_gridSizeX, m_gridSizeY);

	for (int callNdx = 0; callNdx < numDrawCalls; callNdx++)
		gl.drawArrays(GL_TRIANGLES, 0, numVertices);

	glu::readPixels(m_renderCtx, 0, 0, tcu::Surface(1, 1).getAccess()); // \note Serves as a more reliable replacement for glFinish().
}